

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::shaderexecutor::anon_unknown_0::BlockArrayIndexingCase::createInstance
          (BlockArrayIndexingCase *this,Context *ctx)

{
  BlockArrayIndexingCaseInstance *this_00;
  Context *ctx_local;
  BlockArrayIndexingCase *this_local;
  
  this_00 = (BlockArrayIndexingCaseInstance *)operator_new(0x48);
  BlockArrayIndexingCaseInstance::BlockArrayIndexingCaseInstance
            (this_00,ctx,(this->super_OpaqueTypeIndexingCase).m_shaderType,
             &(this->super_OpaqueTypeIndexingCase).m_shaderSpec,
             (this->super_OpaqueTypeIndexingCase).m_name,this->m_blockType,
             (this->super_OpaqueTypeIndexingCase).m_indexExprType,&this->m_readIndices,
             &this->m_inValues);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* BlockArrayIndexingCase::createInstance (Context& ctx) const
{
	return new BlockArrayIndexingCaseInstance(ctx,
											  m_shaderType,
											  m_shaderSpec,
											  m_name,
											  m_blockType,
											  m_indexExprType,
											  m_readIndices,
											  m_inValues);
}